

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

string * __thiscall
minja::Parser::consumeToken
          (string *__return_storage_ptr__,Parser *this,string *token,SpaceHandling space_handling)

{
  char *pcVar1;
  char *pcVar2;
  __type_conflict1 _Var3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar1 = (this->it)._M_current;
  consumeSpaces(this,space_handling);
  pcVar2 = (this->it)._M_current;
  if ((long)token->_M_string_length <= (long)(this->end)._M_current - (long)pcVar2) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((string *)&local_50,pcVar2,pcVar2 + token->_M_string_length);
    _Var3 = std::operator==(&local_50,token);
    std::__cxx11::string::~string((string *)&local_50);
    if (_Var3) {
      (this->it)._M_current = (this->it)._M_current + token->_M_string_length;
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)token);
      return __return_storage_ptr__;
    }
  }
  (this->it)._M_current = pcVar1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string consumeToken(const std::string & token, SpaceHandling space_handling = SpaceHandling::Strip) {
        auto start = it;
        consumeSpaces(space_handling);
        if (std::distance(it, end) >= (int64_t) token.size() && std::string(it, it + token.size()) == token) {
            it += token.size();
            return token;
        }
        it = start;
        return "";
    }